

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HTMLGeneration.cpp
# Opt level: O1

HTMLElement * __thiscall
soul::HTMLGenerator::printExpression(HTMLGenerator *this,HTMLElement *parent,Expression *e)

{
  pointer pSVar1;
  char *__s;
  ulong uVar2;
  HTMLElement *pHVar3;
  size_t sVar4;
  pointer pSVar5;
  string_view linkURL;
  string_view value;
  string_view text;
  string_view classToUse;
  string_view text_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pSVar5 = (e->sections).
           super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pSVar1 = (e->sections).
           super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (pSVar5 == pSVar1) {
      return parent;
    }
    uVar2 = (ulong)pSVar5->type;
    if (3 < uVar2) break;
    __s = *(char **)(&DAT_003011c0 + uVar2 * 8);
    if ((uVar2 == 2) && ((pSVar5->referencedUID)._M_string_length != 0)) {
      std::operator+(&local_50,"#",&pSVar5->referencedUID);
      linkURL._M_str = local_50._M_dataplus._M_p;
      linkURL._M_len = local_50._M_string_length;
      pHVar3 = choc::html::HTMLElement::addLink(parent,linkURL);
      sVar4 = strlen(__s);
      value._M_str = __s;
      value._M_len = sVar4;
      pHVar3 = choc::html::HTMLElement::setClass(pHVar3,value);
      text._M_str = (pSVar5->text)._M_dataplus._M_p;
      text._M_len = (pSVar5->text)._M_string_length;
      choc::html::HTMLElement::addContent(pHVar3,text);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      sVar4 = strlen(__s);
      classToUse._M_str = __s;
      classToUse._M_len = sVar4;
      pHVar3 = choc::html::HTMLElement::addSpan(parent,classToUse);
      text_00._M_str = (pSVar5->text)._M_dataplus._M_p;
      text_00._M_len = (pSVar5->text)._M_string_length;
      choc::html::HTMLElement::addContent(pHVar3,text_00);
    }
    pSVar5 = pSVar5 + 1;
  }
  throwInternalCompilerError
            ("t == SourceCodeModel::Expression::Section::Type::text","operator()",0xb0);
}

Assistant:

choc::html::HTMLElement& printExpression (choc::html::HTMLElement& parent,
                                              const SourceCodeModel::Expression& e)
    {
        auto getClassForTypeSection = [] (SourceCodeModel::Expression::Section::Type t) -> const char*
        {
            if (t == SourceCodeModel::Expression::Section::Type::keyword)   return "keyword";
            if (t == SourceCodeModel::Expression::Section::Type::structure) return "struct_name";
            if (t == SourceCodeModel::Expression::Section::Type::primitive) return "primitive_type";

            SOUL_ASSERT (t == SourceCodeModel::Expression::Section::Type::text);
            return "typename_text";
        };

        for (auto& s : e.sections)
        {
            auto classID = getClassForTypeSection (s.type);

            if (s.type == SourceCodeModel::Expression::Section::Type::structure)
            {
                if (! s.referencedUID.empty())
                {
                    parent.addLink ("#" + s.referencedUID).setClass (classID).addContent (s.text);
                    continue;
                }
            }

            parent.addSpan (classID).addContent (s.text);
        }

        return parent;
    }